

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamState.cpp
# Opt level: O3

void __thiscall
TasDREAM::TasmanianDREAM::getApproximateMode
          (TasmanianDREAM *this,vector<double,_std::allocator<double>_> *mode)

{
  double *pdVar1;
  size_t sVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  double *pdVar6;
  double dVar7;
  
  pdVar6 = (this->pdf_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (this->pdf_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar5 = pdVar6 + 1;
  if (pdVar5 != pdVar1 && pdVar6 != pdVar1) {
    dVar7 = *pdVar6;
    do {
      dVar3 = *pdVar5;
      pdVar4 = pdVar5;
      if (*pdVar5 <= dVar7) {
        dVar3 = dVar7;
        pdVar4 = pdVar6;
      }
      pdVar6 = pdVar4;
      dVar7 = dVar3;
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar1);
  }
  std::vector<double,_std::allocator<double>_>::resize(mode,this->num_dimensions);
  sVar2 = this->num_dimensions;
  if (sVar2 != 0) {
    memmove((mode->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start,
            (this->history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start +
            ((ulong)((long)pdVar6 -
                    (long)(this->pdf_history).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * sVar2,sVar2 << 3);
    return;
  }
  return;
}

Assistant:

void TasmanianDREAM::getApproximateMode(std::vector<double> &mode) const{
    auto imax = std::max_element(pdf_history.begin(), pdf_history.end());
    mode.resize(num_dimensions);
    std::copy_n(history.begin() + std::distance(pdf_history.begin(), imax) * num_dimensions, num_dimensions, mode.data());
}